

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TZGNCore::getDisplayName
          (TZGNCore *this,TimeZone *tz,UTimeZoneGenericNameType type,UDate date,UnicodeString *name)

{
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  UDate local_88;
  UnicodeString local_60;
  
  local_88 = date;
  UnicodeString::setToBogus(name);
  if ((type == UTZGNM_SHORT) || (type == UTZGNM_LONG)) {
    formatGenericNonLocationName(this,tz,type,local_88,name);
    if ((ushort)(name->fUnion).fStackFields.fLengthAndFlags < 0x20) {
      local_98.p_ = ZoneMeta::getCanonicalCLDRID(tz);
      if (local_98.p_ != (UChar *)0x0) {
        UnicodeString::UnicodeString(&local_60,'\x01',&local_98,-1);
        getGenericLocationName(this,&local_60,name);
        UnicodeString::~UnicodeString(&local_60);
      }
    }
  }
  else if (type == UTZGNM_LOCATION) {
    local_90.p_ = ZoneMeta::getCanonicalCLDRID(tz);
    if (local_90.p_ != (UChar *)0x0) {
      UnicodeString::UnicodeString(&local_60,'\x01',&local_90,-1);
      getGenericLocationName(this,&local_60,name);
      UnicodeString::~UnicodeString(&local_60);
    }
  }
  return name;
}

Assistant:

UnicodeString&
TZGNCore::getDisplayName(const TimeZone& tz, UTimeZoneGenericNameType type, UDate date, UnicodeString& name) const {
    name.setToBogus();
    switch (type) {
    case UTZGNM_LOCATION:
        {
            const UChar* tzCanonicalID = ZoneMeta::getCanonicalCLDRID(tz);
            if (tzCanonicalID != NULL) {
                getGenericLocationName(UnicodeString(TRUE, tzCanonicalID, -1), name);
            }
        }
        break;
    case UTZGNM_LONG:
    case UTZGNM_SHORT:
        formatGenericNonLocationName(tz, type, date, name);
        if (name.isEmpty()) {
            const UChar* tzCanonicalID = ZoneMeta::getCanonicalCLDRID(tz);
            if (tzCanonicalID != NULL) {
                getGenericLocationName(UnicodeString(TRUE, tzCanonicalID, -1), name);
            }
        }
        break;
    default:
        break;
    }
    return name;
}